

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::ServiceDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ServiceDescriptorProto *this;
  string *value;
  ServiceDescriptorProto **v1;
  ServiceDescriptorProto **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *other;
  uint32_t *puVar3;
  Arena *arena_00;
  ServiceOptions *pSVar4;
  LogMessage local_a8;
  Voidify local_91;
  uint local_90;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  ServiceDescriptorProto *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  ServiceDescriptorProto *from;
  ServiceDescriptorProto *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_28;
  string *local_20;
  ServiceDescriptorProto *local_18;
  anon_union_48_1_493b367e_for_ServiceDescriptorProto_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (ServiceDescriptorProto *)to_msg;
  _this = (ServiceDescriptorProto *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)MessageLite::GetArena(to_msg);
  local_68 = (ServiceDescriptorProto *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ServiceDescriptorProto_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::ServiceDescriptorProto*>(&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::ServiceDescriptorProto_const*,google::protobuf::ServiceDescriptorProto*>
                       (v1,v2,"&from != _this");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x1d51,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  local_90 = 0;
  this_00 = _internal_mutable_method(from);
  other = _internal_method((ServiceDescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::MethodDescriptorProto>::MergeFrom(this_00,other);
  puVar3 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  this = from;
  local_90 = *puVar3;
  if ((local_90 & 3) != 0) {
    if ((local_90 & 1) != 0) {
      local_20 = _internal_name_abi_cxx11_((ServiceDescriptorProto *)arena);
      local_18 = this;
      local_10 = &this->field_0;
      puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
      value = local_20;
      *puVar3 = *puVar3 | 1;
      arena_00 = MessageLite::GetArena((MessageLite *)this);
      internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,value,arena_00);
    }
    if ((local_90 & 2) != 0) {
      if ((arena->impl_).first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1d5d,"from._impl_.options_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      if ((from->field_0)._impl_.options_ == (ServiceOptions *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.limit_;
        local_28 = absl_log_internal_check_op_result;
        pSVar4 = (ServiceOptions *)
                 Arena::CopyConstruct<google::protobuf::ServiceOptions>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.options_ = pSVar4;
      }
      else {
        ServiceOptions::MergeFrom
                  ((from->field_0)._impl_.options_,
                   (ServiceOptions *)(arena->impl_).first_arena_.limit_);
      }
    }
  }
  uVar1 = local_90;
  puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void ServiceDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ServiceDescriptorProto*>(&to_msg);
  auto& from = static_cast<const ServiceDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ServiceDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_method()->MergeFrom(
      from._internal_method());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}